

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-matrixmultiply.cc
# Opt level: O0

void __thiscall
dynet::MatrixMultiply::forward_dev_impl<dynet::Device_CPU>
          (MatrixMultiply *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  const_reference ppTVar1;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  Tensor *in_stack_00000068;
  uint b;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe78;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe90;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe98;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  *in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffeb4;
  Tensor *in_stack_fffffffffffffeb8;
  uint local_cc;
  
  ppTVar1 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (in_RDX,0);
  if (((*ppTVar1)->d).bd == 1) {
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](in_RDX,0)
    ;
    Tensor::operator*(in_stack_00000068);
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](in_RDX,1)
    ;
    Tensor::colbatch_matrix(in_stack_fffffffffffffeb8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator*(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    Tensor::colbatch_matrix(in_stack_fffffffffffffeb8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::noalias(in_stack_fffffffffffffe78);
    Eigen::
    NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator=(in_stack_fffffffffffffea0,
              (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
               *)in_stack_fffffffffffffe98);
  }
  else {
    for (local_cc = 0;
        ppTVar1 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                  operator[](in_RDX,0), local_cc < ((*ppTVar1)->d).bd; local_cc = local_cc + 1) {
      std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                (in_RDX,0);
      Tensor::batch_matrix(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                (in_RDX,1);
      Tensor::batch_matrix(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      operator*(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      Tensor::batch_matrix(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      Eigen::
      MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      noalias(in_stack_fffffffffffffe78);
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator=(in_stack_fffffffffffffea0,
                  (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                   *)in_stack_fffffffffffffe98);
    }
  }
  return;
}

Assistant:

void MatrixMultiply::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  DYNET_ASSERT(xs.size() == 2, "Failed dimension check in MatrixMultiply::forward");
#ifdef __CUDACC__
  // fx = 0*fx + xs[0] * xs[1]
  dynet::MatrixMultiply(dev, *xs[0], *xs[1], fx, kSCALAR_ZERO);
#else
  DYNET_ASSERT(fx.d.bd == max(xs[0]->d.bd, xs[1]->d.bd), "Failed dimension check in MatrixMultiply::forward");
  if(xs[0]->d.bd == 1) {
    // If the left side has one batch, multiply by columns
    // [x, z, b] = [x, y] * [y, z, b]
    // -> [x, z*b] = [x, y], [y, z*b]
    fx.colbatch_matrix().noalias() = **xs[0] * xs[1]->colbatch_matrix();
  } else {
    // Otherwise, loop over the batches
    DYNET_ASSERT(xs[1]->d.bd == 1 || xs[1]->d.bd == xs[0]->d.bd, "Failed dimension check in MatrixMultiply::forward");
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      fx.batch_matrix(b).noalias() = xs[0]->batch_matrix(b) * xs[1]->batch_matrix(b);
  }
#endif
}